

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O1

void __thiscall asl::XdlEncoder::~XdlEncoder(XdlEncoder *this)

{
  if (this->_sink != (XdlSink *)0x0) {
    (*this->_sink->_vptr_XdlSink[1])();
  }
  if ((this->_sep2)._size != 0) {
    free((this->_sep2).field_2._str);
  }
  if ((this->_sep1)._size != 0) {
    free((this->_sep1).field_2._str);
  }
  if ((this->_indent)._size != 0) {
    free((this->_indent).field_2._str);
  }
  if ((this->_out)._size != 0) {
    free((this->_out).field_2._str);
    return;
  }
  return;
}

Assistant:

XdlEncoder::~XdlEncoder()
{
	delete _sink;
}